

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::
DescriptorPoolTypeResolverSyntaxTest_EditionsEnumFeatures_Test::
~DescriptorPoolTypeResolverSyntaxTest_EditionsEnumFeatures_Test
          (DescriptorPoolTypeResolverSyntaxTest_EditionsEnumFeatures_Test *this)

{
  DescriptorPoolTypeResolverSyntaxTest::~DescriptorPoolTypeResolverSyntaxTest
            (&this->super_DescriptorPoolTypeResolverSyntaxTest);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, EditionsEnumFeatures) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "editions"
    edition: EDITION_2023
    enum_type {
      name: "MyEnum"
      value: { name: "FOO" number: 1 }
      options { features { enum_type: CLOSED } }
    }
  )pb");

  Enum enm;
  ASSERT_TRUE(resolver_->ResolveEnumType(GetTypeUrl("test.MyEnum"), &enm).ok());
  EXPECT_THAT(
      enm, EqualsProto(R"pb(
        name: "test.MyEnum"
        enumvalue { name: "FOO" number: 1 }
        options {
          name: "features"
          value {
            [type.googleapis.com/google.protobuf.FeatureSet] { enum_type: CLOSED }
          }
        }
        source_context { file_name: "foo" }
        syntax: SYNTAX_EDITIONS
        edition: "2023"
      )pb"));
}